

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# some_types.h
# Opt level: O1

void hiberlite::hibernate<hiberlite::AVisitor<hiberlite::KillChildren>,int>
               (AVisitor<hiberlite::KillChildren> *ar,vector<int,_std::allocator<int>_> *v,
               uint param_3)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer piVar2;
  undefined1 *local_c0;
  long local_b8;
  undefined1 local_b0 [16];
  vector<int,_std::allocator<int>_> *local_a0;
  pointer piStack_98;
  int local_90;
  undefined4 uStack_8c;
  undefined1 *local_88;
  long local_80;
  undefined1 local_78 [16];
  collection_nvp<int,_hiberlite::stl_stream_adapter<int,_std::vector<int,_std::allocator<int>_>_>_>
  local_68;
  
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"items","");
  piVar2 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  local_c0 = local_b0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_c0,local_88,local_88 + local_80);
  local_a0 = v;
  piStack_98 = piVar2;
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  paVar1 = &local_68.name.field_2;
  local_68.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_68,local_c0,local_c0 + local_b8);
  local_68.stream.xx = local_90;
  local_68.stream._20_4_ = uStack_8c;
  local_68.stream.ct = local_a0;
  local_68.stream.it._M_current = piStack_98;
  AVisitor<hiberlite::KillChildren>::operator&(ar,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.name._M_dataplus._M_p);
  }
  if (local_c0 != local_b0) {
    operator_delete(local_c0);
  }
  return;
}

Assistant:

void hibernate(A& ar, std::vector<E>& v, const unsigned int)
{
	collection_nvp<E,stl_stream_adapter<E,std::vector<E> > > body( "items", stl_stream_adapter<E,std::vector<E> >(v) );
	ar & body;
}